

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

void __thiscall QPDFJob::AttConfig::AttConfig(AttConfig *this,Config *c)

{
  this->config = c;
  (this->att).path._M_dataplus._M_p = (pointer)&(this->att).path.field_2;
  (this->att).path._M_string_length = 0;
  (this->att).path.field_2._M_local_buf[0] = '\0';
  (this->att).key._M_dataplus._M_p = (pointer)&(this->att).key.field_2;
  (this->att).key._M_string_length = 0;
  (this->att).key.field_2._M_local_buf[0] = '\0';
  (this->att).filename._M_dataplus._M_p = (pointer)&(this->att).filename.field_2;
  (this->att).filename._M_string_length = 0;
  (this->att).filename.field_2._M_local_buf[0] = '\0';
  (this->att).creationdate._M_dataplus._M_p = (pointer)&(this->att).creationdate.field_2;
  (this->att).creationdate._M_string_length = 0;
  (this->att).creationdate.field_2._M_local_buf[0] = '\0';
  (this->att).moddate._M_dataplus._M_p = (pointer)&(this->att).moddate.field_2;
  (this->att).moddate._M_string_length = 0;
  (this->att).moddate.field_2._M_local_buf[0] = '\0';
  (this->att).mimetype._M_dataplus._M_p = (pointer)&(this->att).mimetype.field_2;
  (this->att).mimetype._M_string_length = 0;
  (this->att).mimetype.field_2._M_local_buf[0] = '\0';
  (this->att).description._M_dataplus._M_p = (pointer)&(this->att).description.field_2;
  (this->att).description._M_string_length = 0;
  (this->att).description.field_2._M_local_buf[0] = '\0';
  (this->att).replace = false;
  return;
}

Assistant:

QPDFJob::AttConfig::AttConfig(Config* c) :
    config(c)
{
}